

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::LegacyScriptPubKeyMan::GetKeyFromPool
          (LegacyScriptPubKeyMan *this,CPubKey *result,OutputType type)

{
  WalletStorage *pWVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  WalletDatabase *pWVar5;
  bool bVar6;
  long in_FS_OFFSET;
  WalletBatch batch;
  int64_t nIndex;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock45;
  CKeyPool keypool;
  WalletBatch local_f0;
  int64_t local_e0;
  OutputType local_d4;
  unique_lock<std::recursive_mutex> local_d0;
  CPubKey local_b9;
  CKeyPool local_78;
  long local_28;
  undefined4 extraout_var;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_d4 = type;
  if (type == BECH32M) {
    __assert_fail("type != OutputType::BECH32M",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x592,
                  "bool wallet::LegacyScriptPubKeyMan::GetKeyFromPool(CPubKey &, const OutputType)")
    ;
  }
  bVar6 = false;
  iVar4 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xd])(this,0);
  if ((char)iVar4 == '\0') goto LAB_00bea23f;
  CKeyPool::CKeyPool(&local_78);
  local_d0._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_d0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_d0);
  bVar2 = ReserveKeyFromKeyPool(this,&local_e0,&local_78,false);
  if (bVar2) {
LAB_00bea18d:
    (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[7])
              (this,local_e0,&local_d4);
    memcpy(result,&local_78.vchPubKey,0x41);
    bVar3 = 1;
  }
  else {
    pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    iVar4 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x100000000);
    if ((char)iVar4 != '\0') goto LAB_00bea18d;
    iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage
              [10])();
    if ((char)iVar4 == '\0') {
      iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage
                [3])();
      pWVar5 = (WalletDatabase *)CONCAT44(extraout_var,iVar4);
      (*pWVar5->_vptr_WalletDatabase[0xe])(&local_f0,pWVar5,1);
      local_f0.m_database = pWVar5;
      GenerateNewKey(&local_b9,this,&local_f0,&(this->super_LegacyDataSPKM).m_hd_chain,false);
      memcpy(result,&local_b9,0x41);
      if (local_f0.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0)
      {
        (*(*(_func_int ***)
            local_f0.m_batch._M_t.
            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
      }
      bVar6 = true;
    }
    else {
      bVar6 = false;
    }
    bVar3 = 0;
  }
  bVar6 = (bool)(bVar6 | bVar3);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_d0);
LAB_00bea23f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::GetKeyFromPool(CPubKey& result, const OutputType type)
{
    assert(type != OutputType::BECH32M);
    if (!CanGetAddresses(/*internal=*/ false)) {
        return false;
    }

    CKeyPool keypool;
    {
        LOCK(cs_KeyStore);
        int64_t nIndex;
        if (!ReserveKeyFromKeyPool(nIndex, keypool, /*fRequestedInternal=*/ false) && !m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
            if (m_storage.IsLocked()) return false;
            WalletBatch batch(m_storage.GetDatabase());
            result = GenerateNewKey(batch, m_hd_chain, /*internal=*/ false);
            return true;
        }
        KeepDestination(nIndex, type);
        result = keypool.vchPubKey;
    }
    return true;
}